

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

decimal_fp<float> fmt::v11::detail::dragonbox::shorter_interval_case<float>(int exponent)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  byte bVar5;
  ulong uVar6;
  uint uVar7;
  char cVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar8;
  
  if (0x1721 < exponent + 0xba9U) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O1/_deps/fmt-src/include/fmt/format-inl.h"
                ,0xd3,"too large exponent");
  }
  uVar7 = exponent * 0x9a209 + -0x3fe1f >> 0x15;
  uVar8 = (ulong)uVar7;
  if (0x4d < 0x1f - uVar7) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O1/_deps/fmt-src/include/fmt/format-inl.h"
                ,0x115,"k is out of range");
  }
  cVar9 = (char)((int)(uVar7 * -0x1a934f) >> 0x13) + (char)exponent;
  uVar1 = *(ulong *)(cache_accessor<float>::get_cached_power(int)::pow10_significands +
                    (ulong)(0x1f - uVar7) * 8);
  bVar5 = 0x28 - cVar9;
  uVar11 = (uVar1 >> 0x18) + uVar1 >> (bVar5 & 0x3f);
  uVar10 = (uint)((exponent & 0xfffffffeU) != 2) + (int)(uVar1 - (uVar1 >> 0x19) >> (bVar5 & 0x3f));
  uVar12 = uVar11 & 0xffffffff;
  uVar6 = uVar12 / 10;
  if ((uint)((int)(uVar12 / 10) * 10) < uVar10) {
    uVar2 = (int)(uVar1 >> (0x27U - cVar9 & 0x3f)) + 1U >> 1;
    if (exponent == -0x23) {
      uVar2 = uVar2 & 0xfffffffe;
    }
    else {
      uVar2 = uVar2 + (uVar2 < uVar10);
    }
  }
  else {
    if ((uint)uVar11 < 10) {
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O1/_deps/fmt-src/include/fmt/format-inl.h"
                  ,0x482,"");
    }
    uVar10 = 0;
    while( true ) {
      uVar3 = (uint)uVar6;
      uVar2 = uVar3 * 0x40000000 | uVar3 * -0x3d70a3d7 >> 2;
      if (0x28f5c28 < uVar2) break;
      uVar6 = (ulong)uVar2;
      uVar10 = uVar10 + 2;
    }
    uVar4 = uVar3 * -0x33333333 >> 1 | (uint)((uVar3 * -0x33333333 & 1) != 0) << 0x1f;
    uVar2 = uVar4;
    if (uVar4 >= 0x1999999a) {
      uVar2 = uVar3;
    }
    uVar8 = (ulong)(uVar7 + 1 + (uVar10 | uVar4 < 0x1999999a));
  }
  return (decimal_fp<float>)((ulong)uVar2 | uVar8 << 0x20);
}

Assistant:

FMT_INLINE decimal_fp<T> shorter_interval_case(int exponent) noexcept {
  decimal_fp<T> ret_value;
  // Compute k and beta
  const int minus_k = floor_log10_pow2_minus_log10_4_over_3(exponent);
  const int beta = exponent + floor_log2_pow10(-minus_k);

  // Compute xi and zi
  using cache_entry_type = typename cache_accessor<T>::cache_entry_type;
  const cache_entry_type cache = cache_accessor<T>::get_cached_power(-minus_k);

  auto xi = cache_accessor<T>::compute_left_endpoint_for_shorter_interval_case(
      cache, beta);
  auto zi = cache_accessor<T>::compute_right_endpoint_for_shorter_interval_case(
      cache, beta);

  // If the left endpoint is not an integer, increase it
  if (!is_left_endpoint_integer_shorter_interval<T>(exponent)) ++xi;

  // Try bigger divisor
  ret_value.significand = zi / 10;

  // If succeed, remove trailing zeros if necessary and return
  if (ret_value.significand * 10 >= xi) {
    ret_value.exponent = minus_k + 1;
    ret_value.exponent += remove_trailing_zeros(ret_value.significand);
    return ret_value;
  }

  // Otherwise, compute the round-up of y
  ret_value.significand =
      cache_accessor<T>::compute_round_up_for_shorter_interval_case(cache,
                                                                    beta);
  ret_value.exponent = minus_k;

  // When tie occurs, choose one of them according to the rule
  if (exponent >= float_info<T>::shorter_interval_tie_lower_threshold &&
      exponent <= float_info<T>::shorter_interval_tie_upper_threshold) {
    ret_value.significand = ret_value.significand % 2 == 0
                                ? ret_value.significand
                                : ret_value.significand - 1;
  } else if (ret_value.significand < xi) {
    ++ret_value.significand;
  }
  return ret_value;
}